

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::flip41(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  tetrahedron *pppdVar1;
  tetrahedron p3;
  double *pdVar2;
  tetrahedron ppdVar3;
  memorypool *pmVar4;
  tetrahedron ppdVar5;
  undefined8 *puVar6;
  int (*paiVar7) [12];
  tetrahedron p0;
  int i;
  int iVar8;
  long lVar9;
  tetrahedron ppdVar10;
  long lVar11;
  ulong *puVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  tetgenmesh *this_00;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  face *pfVar21;
  tetrahedron *pppdVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  triface topcastets [3];
  face flipshs [4];
  triface local_110;
  tetrahedron local_100;
  tetrahedron local_f8;
  tetgenmesh *local_f0;
  ulong local_e8;
  tetrahedron *local_e0;
  tetrahedron local_d8;
  double local_d0;
  tetrahedron local_c8;
  ulong local_c0;
  ulong uStack_b8;
  ulong local_b0 [5];
  double local_88;
  double local_80;
  face local_78 [3];
  ulong local_48;
  uint local_40;
  
  local_d0 = (double)CONCAT44(local_d0._4_4_,hullflag);
  lVar9 = 8;
  do {
    *(undefined8 *)((long)&local_c0 + lVar9) = 0;
    *(undefined4 *)((long)local_b0 + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  local_110.tet = (tetrahedron *)0x0;
  local_110.ver = 0;
  lVar9 = 0;
  do {
    *(undefined8 *)((long)&local_78[0].sh + lVar9) = 0;
    *(undefined4 *)((long)&local_78[0].shver + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  pppdVar22 = fliptets->tet;
  pppdVar1 = fliptets[3].tet;
  uVar19 = fliptets[3].ver;
  local_c8 = pppdVar1[orgpivot[(int)uVar19]];
  local_f8 = pppdVar1[destpivot[(int)uVar19]];
  local_100 = pppdVar1[apexpivot[(int)uVar19]];
  p3 = pppdVar22[destpivot[fliptets->ver]];
  local_d8 = pppdVar22[orgpivot[fliptets->ver]];
  this->flip41count = this->flip41count + 1;
  lVar9 = 8;
  do {
    lVar11 = *(long *)((long)fliptets + lVar9 + -8);
    *(long *)((long)&local_c0 + lVar9) = lVar11;
    iVar8 = enexttbl[*(int *)((long)&fliptets->tet + lVar9)];
    *(int *)((long)local_b0 + lVar9 + -8) = iVar8;
    uVar15 = *(ulong *)(lVar11 + (long)facepivot1[iVar8] * 8);
    uVar20 = (uint)uVar15 & 0xf;
    *(uint *)((long)local_b0 + lVar9 + -8) = uVar20;
    *(ulong *)((long)&local_c0 + lVar9) = uVar15 & 0xfffffffffffffff0;
    *(int *)((long)local_b0 + lVar9 + -8) = enexttbl[facepivot2[iVar8][uVar20]];
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  ppdVar10 = pppdVar1[uVar19 & 3];
  local_c0 = (ulong)fsymtbl[(int)uVar19][(uint)ppdVar10 & 0xf];
  if (this->checksubfaceflag == 0) {
    iVar8 = -1;
  }
  else {
    iVar8 = fliptets[3].ver;
    uVar18 = 0;
    uVar15 = 0xffffffff;
    pfVar21 = local_78;
    uVar19 = 0;
    do {
      local_110.tet = (tetrahedron *)((ulong)pppdVar1[facepivot1[iVar8]] & 0xfffffffffffffff0);
      local_110.ver = facepivot2[iVar8][(uint)pppdVar1[facepivot1[iVar8]] & 0xf];
      if (local_110.tet[9] == (tetrahedron)0x0) {
        pfVar21->sh = (shellface *)0x0;
      }
      else {
        pdVar2 = local_110.tet[9][local_110.ver & 3];
        uVar20 = (uint)pdVar2 & 7;
        pfVar21->shver = uVar20;
        pfVar21->sh = (shellface *)((ulong)pdVar2 & 0xfffffffffffffff8);
        pfVar21->shver = tspivottbl[local_110.ver][uVar20];
      }
      bVar23 = pfVar21->sh != (shellface *)0x0;
      if (bVar23) {
        uVar15 = uVar18 & 0xffffffff;
      }
      uVar19 = uVar19 + bVar23;
      iVar8 = enexttbl[iVar8];
      fliptets[3].ver = iVar8;
      uVar18 = uVar18 + 1;
      pfVar21 = pfVar21 + 1;
    } while (uVar18 != 3);
    iVar14 = (int)uVar15;
    iVar8 = iVar14;
    local_e0 = pppdVar22;
    if ((uVar19 != 0) && (iVar8 = 3, uVar19 < 3)) {
      uVar15 = *(ulong *)(local_b0[(long)iVar14 * 2 + -1] +
                         (ulong)((uint)local_b0[(long)iVar14 * 2] & 3) * 8);
      local_110.tet = (tetrahedron *)(uVar15 & 0xfffffffffffffff0);
      piVar16 = fsymtbl[(int)(uint)local_b0[(long)iVar14 * 2]] + ((uint)uVar15 & 0xf);
      ppdVar3 = local_110.tet[9];
      lVar9 = 8;
      do {
        iVar8 = *piVar16;
        local_110.ver = esymtbl[iVar8];
        if (ppdVar3 == (tetrahedron)0x0) {
          *(undefined8 *)((long)&local_80 + lVar9) = 0;
        }
        else {
          pdVar2 = ppdVar3[local_110.ver & 3];
          uVar19 = (uint)pdVar2 & 7;
          *(uint *)((long)&local_78[0].sh + lVar9) = uVar19;
          *(ulong *)((long)&local_80 + lVar9) = (ulong)pdVar2 & 0xfffffffffffffff8;
          *(int *)((long)&local_78[0].sh + lVar9) = tspivottbl[local_110.ver][uVar19];
        }
        piVar16 = eprevtbl + iVar8;
        lVar9 = lVar9 + 0x10;
        iVar8 = iVar14;
      } while (lVar9 != 0x38);
    }
  }
  local_e0 = (tetrahedron *)CONCAT44(local_e0._4_4_,iVar8);
  fliptets->ver = 0xb;
  *(undefined4 *)((long)pppdVar22 + (long)this->elemmarkerindex * 4) = 0;
  if ((this->checksubsegflag != 0) && (ppdVar3 = pppdVar22[8], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = this->tet2segpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[8] = (tetrahedron)0x0;
  }
  if ((this->checksubfaceflag != 0) && (ppdVar3 = fliptets->tet[9], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = this->tet2subpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[9] = (tetrahedron)0x0;
  }
  local_e8 = (ulong)ppdVar10 & 0xfffffffffffffff0;
  lVar9 = 0x10;
  local_f0 = this;
  do {
    tetrahedrondealloc(this,*(tetrahedron **)((long)&fliptets->tet + lVar9));
    ppdVar3 = local_d8;
    ppdVar10 = local_f8;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  ppdVar5 = (tetrahedron)this->dummypoint;
  if (local_d8 != ppdVar5) {
    *(uint *)((long)local_d8 + (long)this->pointmarkindex * 4 + 4) =
         (uint)*(byte *)((long)local_d8 + (long)this->pointmarkindex * 4 + 4);
    this->unuverts = this->unuverts + 1;
  }
  if (local_d0._0_4_ < 1) {
    iVar8 = fliptets->ver;
    fliptets->tet[orgpivot[iVar8]] = local_c8;
    fliptets->tet[destpivot[iVar8]] = local_f8;
    fliptets->tet[apexpivot[iVar8]] = local_100;
    fliptets->tet[oppopivot[iVar8]] = p3;
    iVar8 = 0;
  }
  else {
    if (local_c8 == ppdVar5) {
      iVar8 = fliptets->ver;
      fliptets->tet[orgpivot[iVar8]] = local_100;
      fliptets->tet[destpivot[iVar8]] = local_f8;
      fliptets->tet[apexpivot[iVar8]] = p3;
      fliptets->tet[oppopivot[iVar8]] = local_c8;
      iVar8 = esymtbl[iVar8];
      fliptets->ver = iVar8;
      fliptets->ver = eprevtbl[iVar8];
      iVar8 = 1;
LAB_001196dc:
      bVar23 = true;
      bVar24 = false;
    }
    else {
      if (local_f8 == ppdVar5) {
        iVar8 = fliptets->ver;
        fliptets->tet[orgpivot[iVar8]] = local_c8;
        fliptets->tet[destpivot[iVar8]] = local_100;
        fliptets->tet[apexpivot[iVar8]] = p3;
        fliptets->tet[oppopivot[iVar8]] = local_f8;
        iVar8 = esymtbl[iVar8];
        fliptets->ver = iVar8;
        fliptets->ver = enexttbl[iVar8];
        iVar8 = 2;
        goto LAB_001196dc;
      }
      if (local_100 == ppdVar5) {
        iVar8 = fliptets->ver;
        fliptets->tet[orgpivot[iVar8]] = local_f8;
        fliptets->tet[destpivot[iVar8]] = local_c8;
        fliptets->tet[apexpivot[iVar8]] = p3;
        fliptets->tet[oppopivot[iVar8]] = local_100;
        fliptets->ver = esymtbl[iVar8];
        iVar8 = 3;
        goto LAB_001196dc;
      }
      iVar8 = fliptets->ver;
      fliptets->tet[orgpivot[iVar8]] = local_c8;
      fliptets->tet[destpivot[iVar8]] = local_f8;
      fliptets->tet[apexpivot[iVar8]] = local_100;
      fliptets->tet[oppopivot[iVar8]] = p3;
      bVar24 = false;
      if (p3 == ppdVar5) {
        iVar8 = 4;
        bVar23 = true;
      }
      else {
        bVar24 = local_d8 == (tetrahedron)this->dummypoint;
        iVar8 = -(uint)bVar24;
        bVar23 = false;
      }
    }
    if (bVar23) {
      this->hullsize = this->hullsize + -2;
    }
    else {
      iVar8 = 0;
      if (bVar24) {
        this->hullsize = this->hullsize + -4;
        iVar8 = -1;
      }
    }
  }
  if (fc->remove_ndelaunay_edge != 0) {
    if (iVar8 < 1) {
      if (iVar8 < 0) {
        dVar25 = tetprismvol((tetgenmesh *)fc,(double *)local_c8,(double *)local_f8,
                             (double *)local_100,(double *)p3);
        local_d8 = (tetrahedron)0x0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar26 = 0.0;
      }
      else {
        this_00 = (tetgenmesh *)fc;
        local_d0 = tetprismvol((tetgenmesh *)fc,(double *)local_d8,(double *)p3,(double *)local_c8,
                               (double *)local_f8);
        ppdVar5 = local_100;
        local_80 = tetprismvol(this_00,(double *)ppdVar3,(double *)p3,(double *)ppdVar10,
                               (double *)local_100);
        p0 = local_c8;
        local_88 = tetprismvol(this_00,(double *)ppdVar3,(double *)p3,(double *)ppdVar5,
                               (double *)local_c8);
        ppdVar10 = local_f8;
        local_d8 = (tetrahedron)
                   tetprismvol(this_00,(double *)p0,(double *)local_f8,(double *)ppdVar5,
                               (double *)local_d8);
        dVar25 = tetprismvol(this_00,(double *)p0,(double *)ppdVar10,(double *)ppdVar5,(double *)p3)
        ;
        dVar26 = local_d0;
        dVar27 = local_88;
        dVar28 = local_80;
      }
    }
    else {
      ppdVar10 = (tetrahedron)this->dummypoint;
      if (local_c8 == ppdVar10) {
        dVar28 = tetprismvol((tetgenmesh *)fc,(double *)local_d8,(double *)p3,(double *)local_f8,
                             (double *)local_100);
        local_d8 = (tetrahedron)0x0;
        dVar27 = 0.0;
LAB_00119850:
        dVar26 = 0.0;
      }
      else {
        if (local_f8 == ppdVar10) {
          dVar27 = tetprismvol((tetgenmesh *)fc,(double *)local_d8,(double *)p3,(double *)local_100,
                               (double *)local_c8);
          local_d8 = (tetrahedron)0x0;
LAB_0011984c:
          dVar28 = 0.0;
          goto LAB_00119850;
        }
        if (local_100 != ppdVar10) {
          local_d8 = (tetrahedron)
                     tetprismvol((tetgenmesh *)fc,(double *)local_c8,(double *)local_f8,
                                 (double *)local_100,(double *)local_d8);
          dVar27 = 0.0;
          goto LAB_0011984c;
        }
        dVar26 = tetprismvol((tetgenmesh *)fc,(double *)local_d8,(double *)p3,(double *)local_c8,
                             (double *)local_f8);
        local_d8 = (tetrahedron)0x0;
        dVar27 = 0.0;
        dVar28 = 0.0;
      }
      dVar25 = 0.0;
    }
    fc->tetprism_vol_sum =
         ((((dVar25 - dVar26) - dVar28) - dVar27) - (double)local_d8) + fc->tetprism_vol_sum;
  }
  iVar8 = fliptets->ver;
  lVar9 = 8;
  do {
    local_110.tet = fliptets->tet;
    local_110.ver = esymtbl[iVar8];
    uVar15 = *(ulong *)((long)&local_c0 + lVar9);
    uVar19 = *(uint *)((long)local_b0 + lVar9 + -8);
    local_110.tet[local_110.ver & 3] =
         (tetrahedron)((long)bondtbl[local_110.ver][(int)uVar19] | uVar15);
    *(ulong *)(uVar15 + (ulong)(uVar19 & 3) * 8) =
         (long)bondtbl[(int)uVar19][local_110.ver] | (ulong)local_110.tet;
    iVar8 = enexttbl[iVar8];
    fliptets->ver = iVar8;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  uVar19 = fliptets->ver;
  fliptets->tet[uVar19 & 3] = (tetrahedron)((long)bondtbl[(int)uVar19][local_c0] | local_e8);
  local_d8 = (tetrahedron)(local_c0 * 3);
  paiVar7 = bondtbl + local_c0;
  local_c0 = (ulong)((uint)local_c0 & 3);
  *(ulong *)(local_e8 + local_c0 * 8) = (long)(*paiVar7)[(int)uVar19] | (ulong)fliptets->tet;
  if (this->checksubsegflag != 0) {
    lVar9 = 0;
    do {
      pppdVar22 = (tetrahedron *)local_b0[lVar9 * 2 + -1];
      uVar19 = eprevtbl[(int)local_b0[lVar9 * 2]];
      if ((pppdVar22[8] != (tetrahedron)0x0) &&
         (pdVar2 = pppdVar22[8][ver2edge[(int)uVar19]], pdVar2 != (double *)0x0)) {
        pppdVar22 = fliptets->tet;
        uVar19 = enexttbl[esymtbl[fliptets->ver]];
        if (pppdVar22[8] == (tetrahedron)0x0) {
          ppdVar10 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar22[8] = ppdVar10;
          lVar11 = 0;
          do {
            pppdVar22[8][lVar11] = (double *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 6);
        }
        uVar15 = (ulong)pdVar2 & 0xfffffffffffffff8;
        pppdVar22[8][ver2edge[(int)uVar19]] = pdVar2;
        *(ulong *)(uVar15 + 0x48) = (long)(int)uVar19 | (ulong)pppdVar22;
        this = local_f0;
        if ((fc->chkencflag & 1) != 0) {
          uVar20 = *(uint *)(uVar15 + 4 + (long)local_f0->shmarkindex * 4);
          if ((uVar20 & 4) == 0) {
            pmVar4 = local_f0->badsubsegs;
            *(uint *)(uVar15 + 4 + (long)local_f0->shmarkindex * 4) = uVar20 | 4;
            puVar12 = (ulong *)memorypool::alloc(pmVar4);
            *puVar12 = uVar15;
            *(uint *)(puVar12 + 1) = (uint)pdVar2 & 7;
            this = local_f0;
          }
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar9 = 0;
    local_110.tet = pppdVar22;
    local_110.ver = uVar19;
    do {
      if ((*(long *)(local_b0[lVar9 * 2 + -1] + 0x40) != 0) &&
         (pdVar2 = *(double **)
                    (*(long *)(local_b0[lVar9 * 2 + -1] + 0x40) +
                    (long)ver2edge[(int)local_b0[lVar9 * 2]] * 8), pdVar2 != (double *)0x0)) {
        if (fliptets->tet[8] == (tetrahedron)0x0) {
          ppdVar10 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets->tet[8] = ppdVar10;
          lVar11 = 0;
          do {
            fliptets->tet[8][lVar11] = (double *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 6);
        }
        iVar8 = fliptets->ver;
        fliptets->tet[8][ver2edge[iVar8]] = pdVar2;
        uVar15 = (ulong)pdVar2 & 0xfffffffffffffff8;
        *(ulong *)(uVar15 + 0x48) = (long)iVar8 | (ulong)fliptets->tet;
        if ((fc->chkencflag & 1) != 0) {
          uVar19 = *(uint *)(uVar15 + 4 + (long)this->shmarkindex * 4);
          if ((uVar19 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar15 + 4 + (long)this->shmarkindex * 4) = uVar19 | 4;
            puVar12 = (ulong *)memorypool::alloc(pmVar4);
            *puVar12 = uVar15;
            *(uint *)(puVar12 + 1) = (uint)pdVar2 & 7;
          }
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
  }
  if (this->checksubfaceflag == 0) goto LAB_0011a0b8;
  lVar9 = 0;
  pppdVar22 = local_110.tet;
  uVar19 = local_110.ver;
  do {
    if (*(long *)(local_b0[lVar9 * 2 + -1] + 0x48) != 0) {
      uVar15 = *(ulong *)(*(long *)(local_b0[lVar9 * 2 + -1] + 0x48) +
                         (ulong)((uint)local_b0[lVar9 * 2] & 3) * 8);
      if (uVar15 != 0) {
        iVar8 = tspivottbl[(int)(uint)local_b0[lVar9 * 2]][(uint)uVar15 & 7];
        pppdVar22 = fliptets->tet;
        uVar19 = esymtbl[fliptets->ver];
        if (pppdVar22[9] == (tetrahedron)0x0) {
          ppdVar10 = (tetrahedron)memorypool::alloc(local_f0->tet2subpool);
          pppdVar22[9] = ppdVar10;
          lVar11 = 0;
          do {
            pppdVar22[9][lVar11] = (double *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
        }
        uVar15 = uVar15 & 0xfffffffffffffff8;
        uVar18 = (long)iVar8 ^ 1;
        pppdVar22[9][uVar19 & 3] = (double *)((long)tsbondtbl[(int)uVar19][uVar18] | uVar15);
        *(ulong *)(uVar15 + 0x48 + (ulong)((uint)uVar18 & 1) * 8) =
             (long)stbondtbl[(int)uVar19][uVar18] | (ulong)pppdVar22;
        if ((fc->chkencflag & 2) != 0) {
          uVar20 = *(uint *)(uVar15 + 4 + (long)local_f0->shmarkindex * 4);
          if ((uVar20 & 4) == 0) {
            pmVar4 = local_f0->badsubfacs;
            *(uint *)(uVar15 + 4 + (long)local_f0->shmarkindex * 4) = uVar20 | 4;
            puVar12 = (ulong *)memorypool::alloc(pmVar4);
            *puVar12 = uVar15;
            *(uint *)(puVar12 + 1) = (uint)uVar18;
          }
        }
      }
    }
    this = local_f0;
    fliptets->ver = enexttbl[fliptets->ver];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_110.tet = pppdVar22;
  local_110.ver = uVar19;
  if ((*(long *)(local_e8 + 0x48) != 0) &&
     (uVar15 = *(ulong *)(*(long *)(local_e8 + 0x48) + local_c0 * 8), uVar15 != 0)) {
    uVar18 = uVar15 & 0xfffffffffffffff8;
    uVar15 = (long)tspivottbl[0][(long)local_d8 * 2 + (ulong)((uint)uVar15 & 7)] ^ 1;
    if (fliptets->tet[9] == (tetrahedron)0x0) {
      ppdVar10 = (tetrahedron)memorypool::alloc(local_f0->tet2subpool);
      fliptets->tet[9] = ppdVar10;
      lVar9 = 0;
      do {
        fliptets->tet[9][lVar9] = (double *)0x0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    uVar19 = fliptets->ver;
    fliptets->tet[9][uVar19 & 3] = (double *)((long)tsbondtbl[(int)uVar19][uVar15] | uVar18);
    *(ulong *)(uVar18 + 0x48 + (ulong)((uint)uVar15 & 1) * 8) =
         (long)stbondtbl[(int)uVar19][uVar15] | (ulong)fliptets->tet;
    if ((fc->chkencflag & 2) != 0) {
      uVar19 = *(uint *)(uVar18 + 4 + (long)this->shmarkindex * 4);
      if ((uVar19 & 4) == 0) {
        pmVar4 = this->badsubfacs;
        *(uint *)(uVar18 + 4 + (long)this->shmarkindex * 4) = uVar19 | 4;
        puVar12 = (ulong *)memorypool::alloc(pmVar4);
        *puVar12 = uVar18;
        *(uint *)(puVar12 + 1) = (uint)uVar15;
      }
    }
  }
  if ((int)local_e0 < 0) goto LAB_0011a0b8;
  lVar9 = 8;
  do {
    *(int *)((long)&local_78[0].sh + lVar9) =
         snextpivot[snextpivot[*(int *)((long)&local_78[0].sh + lVar9)]];
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  lVar9 = 0;
  flip31(this,local_78,0);
  do {
    pmVar4 = this->subfaces;
    puVar6 = *(undefined8 **)((long)&local_78[0].sh + lVar9);
    puVar6[3] = 0;
    *puVar6 = pmVar4->deaditemstack;
    pmVar4->deaditemstack = puVar6;
    pmVar4->items = pmVar4->items + -1;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x30);
  if ((int)local_e0 < 3) {
    uVar18 = (ulong)local_e0 & 0xffffffff;
    uVar15 = local_b0[uVar18 * 2 + -1];
    if (*(long *)(uVar15 + 0x48) == 0) {
      pvVar13 = memorypool::alloc(this->tet2subpool);
      *(void **)(uVar15 + 0x48) = pvVar13;
      lVar9 = 0;
      do {
        *(undefined8 *)(*(long *)(uVar15 + 0x48) + lVar9 * 8) = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    uVar19 = (uint)local_b0[uVar18 * 2];
    uVar17 = (ulong)(int)local_40;
    uVar18 = (ulong)((uVar19 & 3) << 3);
    *(ulong *)(*(long *)(uVar15 + 0x48) + uVar18) = (long)tsbondtbl[(int)uVar19][uVar17] | local_48;
    *(ulong *)(local_48 + 0x48 + (ulong)(local_40 & 1) * 8) =
         (long)stbondtbl[(int)uVar19][uVar17] | uVar15;
    uVar15 = *(ulong *)(uVar15 + uVar18);
    pppdVar22 = (tetrahedron *)(uVar15 & 0xfffffffffffffff0);
    uVar19 = fsymtbl[(int)uVar19][(uint)uVar15 & 0xf];
    local_110.tet = pppdVar22;
    local_110.ver = uVar19;
    if (pppdVar22[9] == (tetrahedron)0x0) {
      local_e8 = uVar17;
      ppdVar10 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar22[9] = ppdVar10;
      lVar9 = 0;
      do {
        pppdVar22[9][lVar9] = (double *)0x0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
LAB_0011a063:
      local_40 = (uint)local_e8;
    }
  }
  else {
    if (fliptets->tet[9] == (tetrahedron)0x0) {
      ppdVar10 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      fliptets->tet[9] = ppdVar10;
      lVar9 = 0;
      do {
        fliptets->tet[9][lVar9] = (double *)0x0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    uVar19 = fliptets->ver;
    uVar18 = (ulong)(int)local_40;
    uVar15 = (ulong)((uVar19 & 3) << 3);
    *(ulong *)((long)fliptets->tet[9] + uVar15) = (long)tsbondtbl[(int)uVar19][uVar18] | local_48;
    *(ulong *)(local_48 + 0x48 + (ulong)(local_40 & 1) * 8) =
         (long)stbondtbl[(int)uVar19][uVar18] | (ulong)fliptets->tet;
    uVar15 = *(ulong *)((long)fliptets->tet + uVar15);
    pppdVar22 = (tetrahedron *)(uVar15 & 0xfffffffffffffff0);
    uVar19 = fsymtbl[(int)uVar19][(uint)uVar15 & 0xf];
    local_110.tet = pppdVar22;
    local_110.ver = uVar19;
    if (pppdVar22[9] == (tetrahedron)0x0) {
      local_e8 = uVar18;
      ppdVar10 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar22[9] = ppdVar10;
      lVar9 = 0;
      do {
        pppdVar22[9][lVar9] = (double *)0x0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      goto LAB_0011a063;
    }
  }
  local_40 = local_40 ^ 1;
  pppdVar22[9][uVar19 & 3] = (double *)((long)tsbondtbl[(int)uVar19][(int)local_40] | local_48);
  *(ulong *)(local_48 + 0x48 + (ulong)(local_40 & 1) * 8) =
       (long)stbondtbl[(int)uVar19][(int)local_40] | (ulong)pppdVar22;
LAB_0011a0b8:
  if ((fc->chkencflag & 4) != 0) {
    enqueuetetrahedron(this,fliptets);
  }
  iVar8 = this->point2simindex;
  local_c8[iVar8] = (double *)fliptets->tet;
  local_f8[iVar8] = (double *)fliptets->tet;
  local_100[iVar8] = (double *)fliptets->tet;
  p3[iVar8] = (double *)fliptets->tet;
  if (0 < fc->enqflag) {
    flippush(this,&this->flipstack,fliptets);
    if (1 < fc->enqflag) {
      iVar8 = 3;
      do {
        local_110.tet = fliptets->tet;
        local_110.ver = esymtbl[fliptets->ver];
        flippush(this,&this->flipstack,&local_110);
        fliptets->ver = enexttbl[fliptets->ver];
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip41(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastet;
  triface newface, neightet;
  face flipshs[4];
  point pa, pb, pc, pd, pp;
  int dummyflag = 0; // in {0, 1, 2, 3, 4}
  int spivot = -1, scount = 0;
  int t1ver; 
  int i;

  pa =  org(fliptets[3]);
  pb = dest(fliptets[3]);
  pc = apex(fliptets[3]);
  pd = dest(fliptets[0]);
  pp =  org(fliptets[0]); // The removing vertex.

  flip41count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    enext(fliptets[i], topcastets[i]);
    fnextself(topcastets[i]); // [d,a,b,#], [d,b,c,#], [d,c,a,#]
    enextself(topcastets[i]); // [a,b,d,#], [b,c,d,#], [c,a,d,#]
  }
  fsym(fliptets[3], botcastet); // [b,a,c,#]

  if (checksubfaceflag) {
    // Check if there are three subfaces at 'p'.
    //   Re-use 'newface'.
    for (i = 0; i < 3; i++) {
      fnext(fliptets[3], newface); // [a,b,p,d],[b,c,p,d],[c,a,p,d].
      tspivot(newface, flipshs[i]);
      if (flipshs[i].sh != NULL) {
        spivot = i; // Remember this subface.
        scount++;
      }
      enextself(fliptets[3]);
    }
    if (scount > 0) {
      // There are three subfaces connecting at p.
      if (scount < 3) {
        // The new subface is one of {[a,b,d], [b,c,d], [c,a,d]}.
        // Go to the tet containing the three subfaces.
        fsym(topcastets[spivot], neightet);
        // Get the three subfaces connecting at p.
        for (i = 0; i < 3; i++) {
          esym(neightet, newface);
          tspivot(newface, flipshs[i]);
          eprevself(neightet);
        }
      } else {
        spivot = 3; // The new subface is [a,b,c].
      }
    }
  } // if (checksubfaceflag)


  // Re-use fliptets[0] for [a,b,c,d].
  fliptets[0].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clean all flags.
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
  }
  // Delete the other three tets.
  for (i = 1; i < 4; i++) {
    tetrahedrondealloc(fliptets[i].tet);
  }

  if (pp != dummypoint) {
    // Mark the point pp as unused.
    setpointtype(pp, UNUSEDVERTEX);
    unuverts++;
  }

  // Create the new tet [a,b,c,d].
  if (hullflag > 0) {
    // One of the five vertices may be 'dummypoint'.
    if (pa == dummypoint) {
      // pa is dummypoint.
      setvertices(fliptets[0], pc, pb, pd, pa);
      esymself(fliptets[0]);  // [b,c,a,d]
      eprevself(fliptets[0]); // [a,b,c,d]
      dummyflag = 1;
    } else if (pb == dummypoint) {
      setvertices(fliptets[0], pa, pc, pd, pb);
      esymself(fliptets[0]);  // [c,a,b,d]
      enextself(fliptets[0]); // [a,b,c,d]
      dummyflag = 2;
    } else if (pc == dummypoint) {
      setvertices(fliptets[0], pb, pa, pd, pc);
      esymself(fliptets[0]);  // [a,b,c,d]
      dummyflag = 3;
    } else if (pd == dummypoint) {
      setvertices(fliptets[0], pa, pb, pc, pd);
      dummyflag = 4;
    } else {
      setvertices(fliptets[0], pa, pb, pc, pd);
      if (pp == dummypoint) {
        dummyflag = -1;
      } else {
        dummyflag = 0;
      }
    }
    if (dummyflag > 0) {
      // We deleted 3 hull tets, and create 1 hull tet.
      hullsize -= 2;
    } else if (dummyflag < 0) {
      // We deleted 4 hull tets.
      hullsize -= 4;
      // meshedges does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[4], volpos[1], vol_diff;
    if (dummyflag > 0) {
      if (pa == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = tetprismvol(pp, pd, pb, pc);
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else if (pb == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = tetprismvol(pp, pd, pc, pa);
        volneg[3] = 0.;
      } else if (pc == dummypoint) {
        volneg[0] = tetprismvol(pp, pd, pa, pb);
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = tetprismvol(pa, pb, pc, pp);
      }
      volpos[0] = 0.;
    } else if (dummyflag < 0) {
      volneg[0] = 0.;
      volneg[1] = 0.;
      volneg[2] = 0.;
      volneg[3] = 0.;
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    } else {
      volneg[0] = tetprismvol(pp, pd, pa, pb);
      volneg[1] = tetprismvol(pp, pd, pb, pc);
      volneg[2] = tetprismvol(pp, pd, pc, pa);
      volneg[3] = tetprismvol(pa, pb, pc, pp);
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    }
    vol_diff = volpos[0] - volneg[0] - volneg[1] - volneg[2] - volneg[3];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond the new tet to adjacent tets.
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface); // At faces [b,a,d], [c,b,d], [a,c,d].
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  bond(fliptets[0], botcastet);

  if (checksubsegflag) {
    face checkseg;
    // Bond 6 segments (at edges of [a,b,c,d]) if there there are.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], newface); // At edges [d,a],[d,b],[d,c].
      if (issubseg(newface)) {
        tsspivot1(newface, checkseg);
        esym(fliptets[0], newface);
        enextself(newface); // At edges [a,d], [b,d], [c,d].
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    for (i = 0; i < 3; i++) {
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg); // At edges [a,b],[b,c],[c,a].
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
  }

  if (checksubfaceflag) {
    face checksh;
    // Bond 4 subfaces (at faces of [a,b,c,d]) if there are.
    for (i = 0; i < 3; i++) {
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh); // At faces [a,b,d],[b,c,d],[c,a,d]
        esym(fliptets[0], newface); // At faces [b,a,d],[c,b,d],[a,c,d]
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    if (issubface(botcastet)) {
      tspivot(botcastet, checksh); // At face [b,a,c]
      sesymself(checksh);
      tsbond(fliptets[0], checksh);
      if (fc->chkencflag & 2) {
        enqueuesubface(badsubfacs, &checksh);
      }
    }

    if (spivot >= 0) {
      // Perform a 3-to-1 flip in surface triangulation.
      // Depending on the value of 'spivot', the three subfaces are:
      //   - 0: [a,b,p], [b,d,p], [d,a,p]
      //   - 1: [b,c,p], [c,d,p], [d,b,p] 
      //   - 2: [c,a,p], [a,d,p], [d,c,p] 
      //   - 3: [a,b,p], [b,c,p], [c,a,p]
      // Adjust the three subfaces such that their origins are p, i.e., 
      //   - 3: [p,a,b], [p,b,c], [p,c,a]. (Required by the flip31()).
      for (i = 0; i < 3; i++) {
        senext2self(flipshs[i]);
      }
      flip31(flipshs, 0);
      // Delete the three old subfaces.
      for (i = 0; i < 3; i++) {
        shellfacedealloc(subfaces, flipshs[i].sh);
      }
      if (spivot < 3) {
        // // Bond the new subface to the new tet [a,b,c,d].
        tsbond(topcastets[spivot], flipshs[3]);
        fsym(topcastets[spivot], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      } else {
        // Bound the new subface [a,b,c] to the new tet [a,b,c,d].
        tsbond(fliptets[0], flipshs[3]);
        fsym(fliptets[0], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      }
    } // if (spivot > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    enqueuetetrahedron(&(fliptets[0]));
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    flippush(flipstack, &(fliptets[0])); // [a,b,c] (opposite to new point).
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        esym(fliptets[0], newface);
        flippush(flipstack, &newface);
        enextself(fliptets[0]);
      }
    }
  }

  recenttet = fliptets[0];
}